

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.h
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
BayesianGameCollaborativeGraphical::RestrictIndividualIndicesToScope<unsigned_int>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          BayesianGameCollaborativeGraphical *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indivIndices,Index LRF)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  Scope agSc;
  allocator_type local_31;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_30,
             &(this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
              super__Vector_impl_data._M_start[LRF].super_SDT);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,
             (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_31);
  if ((long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    puVar1 = (indivIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_start;
    puVar2 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = 0;
    do {
      puVar2[uVar3] =
           puVar1[local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3]];
      uVar3 = uVar3 + 1;
    } while ((uVar3 & 0xffffffff) <
             (ulong)((long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

typename std::vector<T> 
BayesianGameCollaborativeGraphical::RestrictIndividualIndicesToScope(const std::vector<T> &indivIndices, Index LRF) const
{
    Index e = LRF;
    Scope agSc = _m_agentScopes[e];
    std::vector<T> restr(agSc.size());
    IndexTools::RestrictIndividualIndicesToScope(indivIndices, agSc, restr);
    return(restr);
}